

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.hpp
# Opt level: O3

void duckdb::BaseNode<(unsigned_char)'\x10',_(duckdb::NType)4>::Free(ART *art,Node *node)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var1;
  idx_t iVar2;
  type paVar3;
  iterator iVar4;
  pointer this;
  data_ptr_t pdVar5;
  ulong uVar6;
  Node *node_00;
  long lVar7;
  ulong local_28;
  
  uVar6 = (node->super_IndexPointer).data;
  paVar3 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var1._M_head_impl =
       paVar3->_M_elems[3].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  local_28 = uVar6 & 0xffffffff;
  iVar4 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&((_Var1._M_head_impl)->buffers)._M_h,&local_28);
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)((long)iVar4.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                              ._M_cur + 0x10));
  pdVar5 = FixedSizeBuffer::Get(this,true);
  lVar7 = (ulong)((uint)(uVar6 >> 0x20) & 0xffffff) * (_Var1._M_head_impl)->segment_size;
  iVar2 = (_Var1._M_head_impl)->bitmask_offset;
  if (pdVar5[iVar2 + lVar7] != '\0') {
    node_00 = (Node *)(pdVar5 + iVar2 + lVar7 + 0x18);
    uVar6 = 0;
    do {
      Node::Free(art,node_00);
      uVar6 = uVar6 + 1;
      node_00 = node_00 + 1;
    } while (uVar6 < pdVar5[iVar2 + lVar7]);
  }
  return;
}

Assistant:

static void Free(ART &art, Node &node) {
		auto &n = Node::Ref<BaseNode>(art, node, TYPE);
		for (uint8_t i = 0; i < n.count; i++) {
			Node::Free(art, n.children[i]);
		}
	}